

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verify_unittest.cc
# Opt level: O3

void __thiscall bssl::VerifyTest_DepthLimit_Test::TestBody(VerifyTest_DepthLimit_Test *this)

{
  char *pcVar1;
  undefined1 uVar2;
  internal iVar3;
  string *psVar4;
  char *in_RCX;
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  CertificateVerifyStatus *in_R8;
  char *message;
  char *in_R9;
  pointer *__ptr;
  string_view filename;
  string_view filename_00;
  string_view filename_01;
  unique_ptr<bssl::VerifyTrustStore,_std::default_delete<bssl::VerifyTrustStore>_> roots;
  VerifyError error;
  string intermediate2;
  string intermediate1;
  string leaf;
  AssertHelper local_170;
  Message local_168;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_160;
  AssertHelper local_158;
  undefined1 local_150 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_140;
  unique_ptr<bssl::VerifyTrustStore,_std::default_delete<bssl::VerifyTrustStore>_> local_130;
  undefined1 local_128 [48];
  string local_f8;
  string local_d8;
  string local_b8;
  undefined1 local_98 [24];
  pointer local_80;
  pointer local_70;
  tuple<bssl::VerifyTrustStore_*,_std::default_delete<bssl::VerifyTrustStore>_> local_60;
  _Storage<long,_true> local_50;
  bool local_48;
  uint32_t local_28;
  
  filename._M_str = in_RCX;
  filename._M_len = (size_t)"google-leaf.der";
  GetTestdata_abi_cxx11_(&local_b8,(bssl *)&DAT_0000000f,filename);
  filename_00._M_str = in_RCX;
  filename_00._M_len = (size_t)"google-intermediate1.der";
  GetTestdata_abi_cxx11_(&local_d8,(bssl *)0x18,filename_00);
  filename_01._M_str = in_RCX;
  filename_01._M_len = (size_t)"google-intermediate2.der";
  GetTestdata_abi_cxx11_(&local_f8,(bssl *)0x18,filename_01);
  CertificateVerifyOptions::CertificateVerifyOptions((CertificateVerifyOptions *)local_98);
  local_98._8_8_ = local_b8._M_string_length;
  local_98._16_8_ = local_b8._M_dataplus._M_p;
  pcVar1 = local_128 + 0x20;
  local_128._0_8_ = local_d8._M_string_length;
  local_128._8_8_ = local_d8._M_dataplus._M_p;
  local_128._16_8_ = local_f8._M_string_length;
  local_128._24_8_ = local_f8._M_dataplus._M_p;
  ::std::
  vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
  ::_M_assign_aux<std::basic_string_view<char,std::char_traits<char>>const*>
            ((vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
              *)&local_80,local_128,pcVar1);
  if (local_48 == false) {
    local_48 = true;
  }
  local_50._M_value = 0x59640654;
  local_28 = 5;
  MozillaRootStore();
  local_60.
  super__Tuple_impl<0UL,_bssl::VerifyTrustStore_*,_std::default_delete<bssl::VerifyTrustStore>_>.
  super__Head_base<0UL,_bssl::VerifyTrustStore_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_bssl::VerifyTrustStore_*,_std::default_delete<bssl::VerifyTrustStore>_>)
       (_Tuple_impl<0UL,_bssl::VerifyTrustStore_*,_std::default_delete<bssl::VerifyTrustStore>_>)
       local_130._M_t.
       super___uniq_ptr_impl<bssl::VerifyTrustStore,_std::default_delete<bssl::VerifyTrustStore>_>.
       _M_t.
       super__Tuple_impl<0UL,_bssl::VerifyTrustStore_*,_std::default_delete<bssl::VerifyTrustStore>_>
       .super__Head_base<0UL,_bssl::VerifyTrustStore_*,_false>._M_head_impl;
  local_128._0_8_ = -1;
  local_128._8_4_ = 0x10;
  local_128._24_8_ = (pointer)0x0;
  local_128[0x20] = '\0';
  local_128._16_8_ = pcVar1;
  CertificateVerify_abi_cxx11_
            ((optional<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)local_150,(bssl *)local_98,(CertificateVerifyOptions *)local_128,(VerifyError *)0x0,
             in_R8);
  local_168.ss_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_4_ =
       CONCAT31(local_168.ss_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl._1_3_,local_140._M_local_buf[8]);
  local_160 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  uVar2 = local_140._M_local_buf[8];
  if ((bool)local_140._M_local_buf[8] == true) {
    local_140._M_local_buf[8] = false;
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_150);
    uVar2 = local_168.ss_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl._0_1_;
  }
  this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_160;
  if ((uVar2 & 1) == 0) {
    testing::Message::Message((Message *)&local_170);
    psVar4 = VerifyError::DiagnosticString_abi_cxx11_((VerifyError *)local_128);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(CONCAT44(local_170.data_._4_4_,local_170.data_._0_4_) + 0x10),
               (psVar4->_M_dataplus)._M_p,psVar4->_M_string_length);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_150,(internal *)&local_168,
               (AssertionResult *)"CertificateVerify(opts, &error)","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_158,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/verify_unittest.cc"
               ,0x83,(char *)CONCAT71(local_150._1_7_,local_150[0]));
    testing::internal::AssertHelper::operator=(&local_158,(Message *)&local_170);
    testing::internal::AssertHelper::~AssertHelper(&local_158);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_150._1_7_,local_150[0]) != &local_140) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_150._1_7_,local_150[0]),
                      (ulong)(local_140._M_allocated_capacity + 1));
    }
    if ((long *)CONCAT44(local_170.data_._4_4_,local_170.data_._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_170.data_._4_4_,local_170.data_._0_4_) + 8))();
    }
    local_150._8_8_ = local_160;
    if (local_160 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    goto LAB_00466e54;
  }
  else {
    if (local_160 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      ::std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()(this_00,local_160);
    }
    local_28 = 2;
    CertificateVerify_abi_cxx11_
              ((optional<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)local_150,(bssl *)local_98,(CertificateVerifyOptions *)local_128,
               (VerifyError *)0x0,in_R8);
    local_168.ss_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._0_4_ =
         CONCAT31(local_168.ss_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl._1_3_,local_140._M_local_buf[8]) ^ 1;
    local_160 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    iVar3 = (internal)(local_140._M_local_buf[8] ^ 1);
    if ((bool)local_140._M_local_buf[8] == true) {
      local_140._M_local_buf[8] = false;
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_150);
      iVar3 = local_168.ss_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl._0_1_;
    }
    if (((byte)iVar3 & 1) == 0) {
      testing::Message::Message((Message *)&local_170);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_150,(internal *)&local_168,
                 (AssertionResult *)"CertificateVerify(opts, &error)","true","false",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_158,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/verify_unittest.cc"
                 ,0x87,(char *)CONCAT71(local_150._1_7_,local_150[0]));
      testing::internal::AssertHelper::operator=(&local_158,(Message *)&local_170);
      testing::internal::AssertHelper::~AssertHelper(&local_158);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_150._1_7_,local_150[0]) != &local_140) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT71(local_150._1_7_,local_150[0]),
                        (ulong)(local_140._M_allocated_capacity + 1));
      }
      if ((long *)CONCAT44(local_170.data_._4_4_,local_170.data_._0_4_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(local_170.data_._4_4_,local_170.data_._0_4_) + 8))();
      }
    }
    if (local_160 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      ::std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_160,local_160);
    }
    local_168.ss_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._0_4_ = VerifyError::Code((VerifyError *)local_128);
    local_170.data_._0_4_ = 0xe;
    testing::internal::CmpHelperEQ<bssl::VerifyError::StatusCode,bssl::VerifyError::StatusCode>
              ((internal *)local_150,"error.Code()",
               "VerifyError::StatusCode::PATH_DEPTH_LIMIT_REACHED",(StatusCode *)&local_168,
               (StatusCode *)&local_170);
    if (local_150[0] == '\0') {
      testing::Message::Message(&local_168);
      psVar4 = VerifyError::DiagnosticString_abi_cxx11_((VerifyError *)local_128);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)
                 (CONCAT44(local_168.ss_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl._4_4_,
                           (StatusCode)
                           local_168.ss_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl) + 0x10),(psVar4->_M_dataplus)._M_p,
                 psVar4->_M_string_length);
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_150._8_8_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        message = "";
      }
      else {
        message = ((_Alloc_hider *)local_150._8_8_)->_M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_170,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/verify_unittest.cc"
                 ,0x88,message);
      testing::internal::AssertHelper::operator=(&local_170,&local_168);
      testing::internal::AssertHelper::~AssertHelper(&local_170);
      if ((long *)CONCAT44(local_168.ss_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl._4_4_,
                           (StatusCode)
                           local_168.ss_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(local_168.ss_._M_t.
                                       super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       .
                                       super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                       ._M_head_impl._4_4_,
                                       (StatusCode)
                                       local_168.ss_._M_t.
                                       super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       .
                                       super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                       ._M_head_impl) + 8))();
      }
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_150._8_8_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) goto LAB_00466e54;
    this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)(local_150 + 8);
  }
  ::std::
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  operator()(this_00,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     local_150._8_8_);
LAB_00466e54:
  if ((char *)local_128._16_8_ != pcVar1) {
    operator_delete((void *)local_128._16_8_,CONCAT71(local_128._33_7_,local_128[0x20]) + 1);
  }
  ::std::unique_ptr<bssl::VerifyTrustStore,_std::default_delete<bssl::VerifyTrustStore>_>::
  ~unique_ptr(&local_130);
  if (local_80 != (pointer)0x0) {
    operator_delete(local_80,(long)local_70 - (long)local_80);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
    operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

TEST(VerifyTest, DepthLimit) {
  const std::string leaf = GetTestdata("google-leaf.der");
  const std::string intermediate1 = GetTestdata("google-intermediate1.der");
  const std::string intermediate2 = GetTestdata("google-intermediate2.der");
  CertificateVerifyOptions opts;
  opts.leaf_cert = leaf;
  opts.intermediates = {intermediate1, intermediate2};
  opts.time = 1499727444;
  // Set the |max_path_building_depth| explicitly to test the non-default case.
  // Depth of 5 is enough to successfully find a path.
  opts.max_path_building_depth = 5;
  std::unique_ptr<VerifyTrustStore> roots = MozillaRootStore();
  opts.trust_store = roots.get();

  VerifyError error;
  ASSERT_TRUE(CertificateVerify(opts, &error)) << error.DiagnosticString();

  // Depth of 2 is not enough to find a path.
  opts.max_path_building_depth = 2;
  EXPECT_FALSE(CertificateVerify(opts, &error));
  ASSERT_EQ(error.Code(), VerifyError::StatusCode::PATH_DEPTH_LIMIT_REACHED)
      << error.DiagnosticString();
}